

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O2

pair<int,_unsigned_long> * __thiscall
AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
          (AddressMap<std::pair<int,_unsigned_long>_> *this,Key key)

{
  Cluster *pCVar1;
  long *plVar2;
  pair<int,_unsigned_long> *ppVar3;
  
  ppVar3 = (pair<int,_unsigned_long> *)0x0;
  pCVar1 = FindCluster(this,(Number)key,false);
  if (pCVar1 != (Cluster *)0x0) {
    plVar2 = (long *)((long)pCVar1->blocks + (ulong)((uint)((ulong)key >> 4) & 0xfff8));
    do {
      plVar2 = (long *)*plVar2;
      if (plVar2 == (long *)0x0) {
        return (pair<int,_unsigned_long> *)0x0;
      }
    } while ((Key)plVar2[1] != key);
    ppVar3 = (pair<int,_unsigned_long> *)(plVar2 + 2);
  }
  return ppVar3;
}

Assistant:

inline Value* AddressMap<Value>::FindMutable(Key key) {
  const Number num = reinterpret_cast<Number>(key);
  const Cluster* const c = FindCluster(num, false/*do not create*/);
  if (c != nullptr) {
    for (Entry* e = c->blocks[BlockID(num)]; e != nullptr; e = e->next) {
      if (e->key == key) {
        return &e->value;
      }
    }
  }
  return nullptr;
}